

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash_dictionary_handler.c
# Opt level: O3

ion_cursor_status_t oadict_next(ion_dict_cursor_t *cursor,ion_record_t *record)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ion_dictionary_parent_t *piVar4;
  ion_dictionary_compare_t p_Var5;
  ion_err_t iVar6;
  int iVar7;
  long lVar8;
  ion_oadict_cursor_t *oadict_cursor;
  
  cVar1 = cursor->status;
  switch(cVar1) {
  case '\x01':
  case '\x03':
    return cVar1;
  case '\x02':
  case '\x04':
    break;
  default:
    return '\0';
  }
  piVar4 = cursor->dictionary->instance;
  iVar2 = (piVar4->record).key_size;
  iVar3 = (piVar4->record).value_size;
  if (cVar1 == '\x04') {
    iVar6 = oadict_scan((ion_oadict_cursor_t *)cursor);
    if (iVar6 == '\x01') {
      cursor->status = '\x01';
      return '\x01';
    }
    iVar7 = (piVar4->record).key_size;
  }
  else {
    cursor->status = '\x04';
    iVar7 = iVar2;
  }
  p_Var5 = piVar4[1].compare;
  lVar8 = (long)(iVar2 + iVar3 + 1) * (long)*(int *)&cursor[1].field_0x4;
  memcpy(record->key,p_Var5 + lVar8 + 1,(long)iVar7);
  memcpy(record->value,p_Var5 + (piVar4->record).key_size + lVar8 + 1,
         (long)(piVar4->record).value_size);
  return cursor->status;
}

Assistant:

ion_cursor_status_t
oadict_next(
	ion_dict_cursor_t	*cursor,
	ion_record_t		*record
) {
	ion_oadict_cursor_t *oadict_cursor = (ion_oadict_cursor_t *) cursor;

	/* check the status of the cursor and if it is not valid or at the end, just exit */
	if (cursor->status == cs_cursor_uninitialized) {
		return cursor->status;
	}
	else if (cursor->status == cs_end_of_results) {
		return cursor->status;
	}
	else if ((cursor->status == cs_cursor_initialized) || (cursor->status == cs_cursor_active)) {
		/* cursor is active and results have never been accessed */
		/* extract reference to map */
		ion_hashmap_t *hash_map = ((ion_hashmap_t *) cursor->dictionary->instance);

		/* assume that the value has been pre-allocated */
		/* compute length of data record stored in map */
		int data_length = hash_map->super.record.key_size + hash_map->super.record.value_size;

		if (cursor->status == cs_cursor_active) {
			/* find the next valid entry */

			/* scan and determine what to do? */
			if (cs_end_of_results == oadict_scan(oadict_cursor)) {
				/* Then this is the end and there are no more results */
				cursor->status = cs_end_of_results;
				return cursor->status;
			}
		}
		else {
			/* if the cursor is initialized but not active, then just read the data and set cursor active */
			cursor->status = cs_cursor_active;
		}

		/* the results are now ready //reference item at given position */
		ion_hash_bucket_t *item = (((ion_hash_bucket_t *) ((hash_map->entry + (data_length + SIZEOF(STATUS)) * oadict_cursor->current /*idx*/))));

		memcpy(record->key, (item->data), hash_map->super.record.key_size);

		memcpy(record->value, (item->data + hash_map->super.record.key_size), hash_map->super.record.value_size);

		/* and update current cursor position */
		return cursor->status;
	}

	/* and if you get this far, the cursor is invalid */
	return cs_invalid_cursor;
}